

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

void __thiscall amrex::BoxArray::BoxArray(BoxArray *this,Box *bxvec,int nbox)

{
  undefined8 *puVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int i;
  long lVar5;
  long lVar6;
  Box bx;
  undefined4 uStack_40;
  int local_3c [2];
  undefined8 uStack_34;
  
  uVar2 = (bxvec->btype).itype;
  (this->m_bat).m_bat_type = (uint)(uVar2 != 0);
  if (uVar2 != 0) {
    (this->m_bat).m_op.m_indexType.m_typ.itype = uVar2;
  }
  std::make_shared<amrex::BARef,int&>((int *)&this->m_ref);
  (this->m_simplified_list).super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_simplified_list).super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  for (lVar5 = 0; lVar5 < nbox; lVar5 = lVar5 + 1) {
    uVar3 = *(undefined8 *)(bxvec->smallend).vect;
    uVar4 = *(undefined8 *)((bxvec->smallend).vect + 2);
    local_3c[1] = (int)((ulong)*(undefined8 *)(bxvec->bigend).vect >> 0x20);
    uStack_34 = *(ulong *)((bxvec->bigend).vect + 2);
    uStack_40 = (undefined4)uVar4;
    local_3c[0] = (int)((ulong)uVar4 >> 0x20);
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      if ((uStack_34._4_4_ >> ((uint)lVar6 & 0x1f) & 1) != 0) {
        local_3c[lVar6] = local_3c[lVar6] + -1;
      }
    }
    bxvec = bxvec + 1;
    uStack_34 = uStack_34 & 0xffffffff;
    lVar6 = *(long *)&(((this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                      super__Vector_impl_data;
    puVar1 = (undefined8 *)(lVar6 + 0xc + lVar5 * 0x1c);
    *puVar1 = CONCAT44(local_3c[1],local_3c[0]);
    puVar1[1] = uStack_34;
    puVar1 = (undefined8 *)(lVar6 + lVar5 * 0x1c);
    *puVar1 = uVar3;
    puVar1[1] = CONCAT44(local_3c[0],uStack_40);
  }
  return;
}

Assistant:

BoxArray::BoxArray (const Box* bxvec, int nbox)
    :
    m_bat(bxvec->ixType()),
    m_ref(std::make_shared<BARef>(nbox))
{
    for (int i = 0; i < nbox; i++) {
        m_ref->m_abox[i] = amrex::enclosedCells(*bxvec++);
    }
}